

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::allTrueI64x2(Literal *__return_storage_ptr__,Literal *this)

{
  Type *__return_storage_ptr___00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  Literal *this_00;
  undefined1 local_80 [8];
  LaneArray<2> lanes;
  
  getLanesI64x2((LaneArray<2> *)local_80,this);
  bVar3 = false;
  __return_storage_ptr___00 = &lanes._M_elems[1].type;
  this_00 = (Literal *)local_80;
  do {
    makeZero((Literal *)__return_storage_ptr___00,(Type)(this_00->type).id);
    bVar2 = operator==(this_00,(Literal *)__return_storage_ptr___00);
    ~Literal((Literal *)__return_storage_ptr___00);
    bVar1 = !bVar3;
    bVar3 = true;
    this_00 = (Literal *)&lanes._M_elems[0].type;
  } while (bVar1 && !bVar2);
  *(uint *)&__return_storage_ptr__->field_0 = (uint)!bVar2;
  (__return_storage_ptr__->type).id = 2;
  lVar4 = 0x18;
  do {
    ~Literal((Literal *)(local_80 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::allTrueI64x2() const {
  return all_true<2, &Literal::getLanesI64x2>(*this);
}